

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

DynamicRectMatrix<double> __thiscall
OpenMD::Polynomial<double>::CreateCompanion(Polynomial<double> *this)

{
  int iVar1;
  double *pdVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  DynamicRectMatrix<double> *in_RDI;
  double dVar4;
  double dVar5;
  DynamicRectMatrix<double> DVar6;
  int j;
  int i;
  double majorCoeff;
  int rank;
  DynamicRectMatrix<double> *mat;
  undefined8 in_stack_ffffffffffffff98;
  DynamicRectMatrix<double> *in_stack_ffffffffffffffa0;
  DynamicRectMatrix<double> *this_00;
  uint local_34;
  uint local_30;
  
  this_00 = in_RDI;
  iVar1 = degree((Polynomial<double> *)in_stack_ffffffffffffffa0);
  DynamicRectMatrix<double>::DynamicRectMatrix
            (in_stack_ffffffffffffffa0,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             (uint)in_stack_ffffffffffffff98);
  dVar4 = getCoefficient((Polynomial<double> *)this_00,
                         (ExponentType)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  uVar3 = extraout_RDX;
  for (local_30 = 0; (int)local_30 < iVar1; local_30 = local_30 + 1) {
    for (local_34 = 0; (int)local_34 < iVar1; local_34 = local_34 + 1) {
      if (local_30 - local_34 == 1) {
        in_stack_ffffffffffffffa0 =
             (DynamicRectMatrix<double> *)
             DynamicRectMatrix<double>::operator()(in_RDI,local_30,local_34);
        in_stack_ffffffffffffffa0->data_ = (double **)0x3ff0000000000000;
        uVar3 = extraout_RDX_00;
      }
      else if (local_34 == iVar1 - 1U) {
        dVar5 = getCoefficient((Polynomial<double> *)this_00,
                               (ExponentType)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
        pdVar2 = DynamicRectMatrix<double>::operator()(in_RDI,local_30,local_34);
        *pdVar2 = -dVar5 / dVar4;
        uVar3 = extraout_RDX_01;
      }
    }
  }
  DVar6.nrow_ = (int)uVar3;
  DVar6.ncol_ = (int)((ulong)uVar3 >> 0x20);
  DVar6.data_ = (double **)this_00;
  return DVar6;
}

Assistant:

DynamicRectMatrix<Real> CreateCompanion() {
      int rank = degree();
      DynamicRectMatrix<Real> mat(rank, rank);
      Real majorCoeff = getCoefficient(rank);
      for (int i = 0; i < rank; ++i) {
        for (int j = 0; j < rank; ++j) {
          if (i - j == 1) {
            mat(i, j) = 1;
          } else if (j == rank - 1) {
            mat(i, j) = -1 * getCoefficient(i) / majorCoeff;
          }
        }
      }
      return mat;
    }